

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O2

bool __thiscall BasePort::ReadAllBoards(BasePort *this)

{
  uchar *puVar1;
  BoardIO *pBVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ostream *poVar7;
  size_t sVar8;
  bool bVar9;
  bool bVar10;
  uint board;
  ulong uVar11;
  allocator<char> local_51;
  string local_50 [32];
  
  iVar3 = (*this->_vptr_BasePort[0x11])();
  if ((char)iVar3 == '\0') {
    poVar7 = std::operator<<(this->outStr,"BasePort::ReadAllBoards: port not initialized");
    std::endl<char,std::char_traits<char>>(poVar7);
  }
  else {
    if (this->Protocol_ == PROTOCOL_BC_QRW) {
      iVar3 = (*this->_vptr_BasePort[0x1e])(this);
      return SUB41(iVar3,0);
    }
    std::__cxx11::string::string<std::allocator<char>>(local_50,"ReadAllBoards",&local_51);
    iVar3 = (*this->_vptr_BasePort[0x1b])(this,local_50,(ulong)this->autoReScan);
    std::__cxx11::string::~string(local_50);
    if ((char)iVar3 != '\0') {
      bVar10 = true;
      uVar11 = 0;
      bVar9 = true;
      do {
        if (this->max_board <= uVar11) {
          if (!bVar9) {
            return bVar10;
          }
          (*this->_vptr_BasePort[8])(this);
          return bVar10;
        }
        if (this->BoardList[uVar11] != (BoardIO *)0x0) {
          puVar1 = this->ReadBufferBroadcast;
          uVar4 = (*this->_vptr_BasePort[0x18])(this);
          uVar5 = (*this->_vptr_BasePort[0x14])(this,4);
          uVar6 = (*this->BoardList[uVar11]->_vptr_BoardIO[1])();
          iVar3 = (*this->_vptr_BasePort[0x26])
                            (this,uVar11 & 0xff,0,puVar1 + (ulong)uVar5 + (ulong)uVar4,(ulong)uVar6)
          ;
          pBVar2 = this->BoardList[uVar11];
          if ((char)iVar3 == '\0') {
            pBVar2->readValid = false;
            pBVar2->numReadErrors = pBVar2->numReadErrors + 1;
            sVar8 = this->ReadErrorCounter_;
            if (sVar8 == 0) {
              poVar7 = std::operator<<(this->outStr,"BasePort::ReadAllBoards: read failed on port ")
              ;
              poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->PortNum);
              poVar7 = std::operator<<(poVar7,", board ");
              poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
              std::endl<char,std::char_traits<char>>(poVar7);
              sVar8 = this->ReadErrorCounter_;
            }
            this->ReadErrorCounter_ = sVar8 + 1;
            if (sVar8 + 1 != 10000) {
              bVar10 = false;
              goto LAB_0010ab50;
            }
            poVar7 = std::operator<<(this->outStr,"BasePort::ReadAllBoards: read failed on port ");
            poVar7 = (ostream *)std::ostream::operator<<(poVar7,this->PortNum);
            poVar7 = std::operator<<(poVar7,", board ");
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            poVar7 = std::operator<<(poVar7," occurred 10,000 times");
            std::endl<char,std::char_traits<char>>(poVar7);
            bVar10 = false;
          }
          else {
            (*pBVar2->_vptr_BoardIO[2])(pBVar2,puVar1 + (ulong)uVar5 + (ulong)uVar4);
            this->BoardList[uVar11]->readValid = true;
            bVar9 = false;
          }
          this->ReadErrorCounter_ = 0;
        }
LAB_0010ab50:
        uVar11 = uVar11 + 1;
      } while( true );
    }
    SetReadInvalid(this);
  }
  (*this->_vptr_BasePort[8])(this);
  return false;
}

Assistant:

bool BasePort::ReadAllBoards(void)
{
    if (!IsOK()) {
        outStr << "BasePort::ReadAllBoards: port not initialized" << std::endl;
        OnNoneRead();
        return false;
    }

    if (Protocol_ == BasePort::PROTOCOL_BC_QRW) {
        return ReadAllBoardsBroadcast();
    }

    if (!CheckFwBusGeneration("ReadAllBoards", autoReScan)) {
        SetReadInvalid();
        OnNoneRead();
        return false;
    }

    bool allOK = true;
    bool noneRead = true;

    bool rtRead = true;
    for (unsigned int board = 0; board < max_board; board++) {
        if (BoardList[board]) {
            quadlet_t *readBuffer = reinterpret_cast<quadlet_t *>(ReadBufferBroadcast + GetReadQuadAlign() + GetPrefixOffset(RD_FW_BDATA));
            bool ret = ReadBlock(board, 0, readBuffer, BoardList[board]->GetReadNumBytes());
            if (ret) {
                BoardList[board]->SetReadData(readBuffer);
                noneRead = false;
            } else {
                allOK = false;
            }
            BoardList[board]->SetReadValid(ret);

            if (ret) {
                ReadErrorCounter_ = 0;
            }
            else {
                if (ReadErrorCounter_ == 0) {
                    outStr << "BasePort::ReadAllBoards: read failed on port "
                           << PortNum << ", board " << board << std::endl;
                }
                ReadErrorCounter_++;
                if (ReadErrorCounter_ == 10000) {
                    outStr << "BasePort::ReadAllBoards: read failed on port "
                           << PortNum << ", board " << board << " occurred 10,000 times" << std::endl;
                    ReadErrorCounter_ = 0;
                }
            }
        }
    }
    if (!rtRead)
        outStr << "BasePort::ReadAllBoards: rtRead is false" << std::endl;

    if (noneRead) {
        OnNoneRead();
    }
    return allOK;
}